

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.h
# Opt level: O2

void __thiscall puppup::trie::Gaddag::Gaddag(Gaddag *this,istream *fin)

{
  pointer pvVar1;
  pointer plVar2;
  pointer plVar3;
  long lVar4;
  _Alloc_hider _Var5;
  idx i;
  long lVar6;
  istream *piVar7;
  ostream *poVar8;
  ulong uVar9;
  long *plVar10;
  pointer pNVar11;
  size_type sVar12;
  ulong uVar13;
  size_type sVar14;
  nodeid nVar15;
  long lVar16;
  byte bVar17;
  chr child_chr_1;
  chr child_chr;
  long lVar18;
  pointer plVar19;
  idx j;
  long lVar20;
  long alStack_408 [83];
  undefined8 uStack_170;
  vector<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_> *local_160;
  vector<long,_std::allocator<long>_> *local_158;
  vector<long,_std::allocator<long>_> *local_150;
  vector<long,_std::allocator<long>_> *local_148;
  long local_140;
  vector<long,_std::allocator<long>_> *local_138;
  string s;
  array<long,_26UL> stridx;
  
  local_160 = &this->nodes_;
  local_138 = &this->node_to_word_;
  (this->next_sibling_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->next_sibling_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->first_child_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->first_child_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->first_child_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->val_).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->val_).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->val_).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->next_sibling_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->next_sibling_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->next_sibling_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->first_child_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->first_child_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->first_child_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->val_).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->words_).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->words_).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->words_).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nodes_).
  super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes_).
  super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes_).
  super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148 = &this->next_sibling_;
  local_150 = &this->first_child_;
  local_158 = &this->val_;
  for (lVar6 = 0; lVar6 != 0x1a; lVar6 = lVar6 + 1) {
    alStack_408["eiaontrsuldgywvpmhfcbzxqkj_    +"[lVar6]] = lVar6;
  }
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  uStack_170 = 0x108f25;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::reserve(&this->words_,200000);
  do {
    uStack_170 = 0x108f35;
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>(fin,(string *)&s);
    if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
      uStack_170 = 0x108ffc;
      std::vector<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>::reserve
                (local_160,
                 (((long)(this->words_).
                         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->words_).
                        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) * 5);
      uStack_170 = 0x109006;
      std::vector<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>::
      emplace_back<>(local_160);
      uStack_170 = 0x109020;
      std::vector<long,_std::allocator<long>_>::reserve
                (local_138,
                 (((long)(this->words_).
                         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->words_).
                        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) * 5);
      uVar9 = ((long)(this->words_).
                     super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->words_).
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      for (uVar13 = 0; uVar13 != (~((long)uVar9 >> 0x3f) & uVar9); uVar13 = uVar13 + 1) {
        pvVar1 = (this->words_).
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar20 = (long)*(pointer *)
                        ((long)&pvVar1[uVar13].super__Vector_base<long,_std::allocator<long>_>.
                                _M_impl + 8) -
                 *(long *)&pvVar1[uVar13].super__Vector_base<long,_std::allocator<long>_>._M_impl >>
                 3;
        lVar6 = -1;
        while (lVar6 < lVar20) {
          nVar15 = 0;
          local_140 = lVar6;
          for (; -1 < lVar6; lVar6 = lVar6 + -1) {
            lVar18 = *(long *)(*(long *)&pvVar1[uVar13].
                                         super__Vector_base<long,_std::allocator<long>_>._M_impl +
                              lVar6 * 8);
            uStack_170 = 0x109096;
            add(this,nVar15,lVar18);
            nVar15 = (local_160->
                     super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                     )._M_impl.super__Vector_impl_data._M_start[nVar15].children._M_elems[lVar18];
          }
          uStack_170 = 0x1090b9;
          add(this,nVar15,0x1f);
          plVar10 = (local_160->
                    super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                    )._M_impl.super__Vector_impl_data._M_start[nVar15].children._M_elems + 0x1f;
          lVar6 = local_140 + 1;
          local_140 = lVar6;
          for (; nVar15 = *plVar10, lVar20 != lVar6; lVar6 = lVar6 + 1) {
            lVar18 = *(long *)(*(long *)&pvVar1[uVar13].
                                         super__Vector_base<long,_std::allocator<long>_>._M_impl +
                              lVar6 * 8);
            uStack_170 = 0x1090f8;
            add(this,nVar15,lVar18);
            plVar10 = (local_160->
                      super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                      )._M_impl.super__Vector_impl_data._M_start[nVar15].children._M_elems + lVar18;
          }
          while (plVar2 = (this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                (long)(this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)plVar2 >> 3 <= nVar15) {
            uStack_170 = 0x10911e;
            std::vector<long,_std::allocator<long>_>::push_back(local_138,&invalid);
          }
          plVar2[nVar15] = uVar13;
          lVar6 = local_140;
        }
      }
      lVar6 = (long)(this->nodes_).
                    super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->nodes_).
                    super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      uVar9 = lVar6 >> 8;
      uStack_170 = 0x109166;
      std::vector<long,_std::allocator<long>_>::resize(local_148,uVar9);
      uStack_170 = 0x109173;
      std::vector<long,_std::allocator<long>_>::resize(local_150,uVar9);
      uStack_170 = 0x109180;
      std::vector<long,_std::allocator<long>_>::resize(local_158,uVar9);
      uVar13 = 0;
      pNVar11 = (local_160->
                super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                )._M_impl.super__Vector_impl_data._M_start;
      plVar2 = (local_150->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      plVar3 = (local_148->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if (uVar13 == (~(lVar6 >> 0x3f) & uVar9)) {
          uStack_170 = 0x10924d;
          std::__cxx11::string::~string((string *)&s);
          return;
        }
        plVar19 = (local_158->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        for (lVar20 = 0; lVar20 != 0x20; lVar20 = lVar20 + 1) {
          lVar18 = (pNVar11->children)._M_elems[lVar20];
          if (lVar18 != -1) {
            plVar19[lVar18] = lVar20;
          }
        }
        lVar20 = 0;
        do {
          if (lVar20 == 0x20) goto LAB_001091f1;
          lVar18 = (pNVar11->children)._M_elems[lVar20];
          lVar20 = lVar20 + 1;
        } while (lVar18 == -1);
        plVar2[uVar13] = lVar18;
LAB_001091f1:
        plVar19 = (local_148->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar20 = -1;
        for (lVar18 = 0; lVar18 != 0x20; lVar18 = lVar18 + 1) {
          lVar4 = (pNVar11->children)._M_elems[lVar18];
          lVar16 = lVar20;
          if ((lVar4 != -1) && (lVar16 = lVar4, lVar20 != -1)) {
            plVar19[lVar20] = lVar4;
          }
          lVar20 = lVar16;
        }
        plVar19 = plVar3 + lVar20;
        if (lVar20 == -1) {
          plVar19 = plVar2 + uVar13;
        }
        uVar13 = uVar13 + 1;
        pNVar11 = pNVar11 + 1;
        *plVar19 = -1;
      } while( true );
    }
    sVar12 = 0;
    do {
      if (s._M_string_length == sVar12) goto LAB_00108f91;
      bVar17 = s._M_dataplus._M_p[sVar12];
      if ((byte)(bVar17 + 0xbf) < 0x1a) {
        bVar17 = bVar17 | 0x20;
        s._M_dataplus._M_p[sVar12] = bVar17;
      }
      sVar12 = sVar12 + 1;
    } while (0xe5 < (byte)(bVar17 + 0x85));
    uStack_170 = 0x108f89;
    poVar8 = std::operator<<((ostream *)&std::cerr,(string *)&s);
    uStack_170 = 0x108f91;
    std::endl<char,std::char_traits<char>>(poVar8);
LAB_00108f91:
    uStack_170 = 0x108f99;
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::emplace_back<>(&this->words_);
    uStack_170 = 0x108fab;
    std::vector<long,_std::allocator<long>_>::reserve
              ((this->words_).
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,s._M_string_length);
    sVar12 = s._M_string_length;
    _Var5 = s._M_dataplus;
    for (sVar14 = 0; sVar12 != sVar14; sVar14 = sVar14 + 1) {
      uStack_170 = 0x108fda;
      std::vector<long,_std::allocator<long>_>::push_back
                ((this->words_).
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,alStack_408 + _Var5._M_p[sVar14]);
    }
  } while( true );
}

Assistant:

explicit Gaddag(std::istream& fin) {
        std::array<idx, 26> stridx;
        for (idx i = 0; i < 26; ++i) {
            stridx[idxstr[i] - 'a'] = i;
        }
        std::string s;
        words_.reserve(200'000);
        while (std::getline(fin, s)) {
            for (char& c : s) {
                if (c >= 'A' && c <= 'Z') {
                    c += 'a' - 'A';
                }
                if (c < 'a' || c > 'z') {
                    std::cerr << s << std::endl;
                    break;
                }
            }
            words_.emplace_back();
            words_.back().reserve(s.length());
            for (char c : s) {
                words_.back().push_back(stridx[c - 'a']);
            }
        }
        nodes_.reserve(5 * words_.size());
        nodes_.emplace_back();  // root
        node_to_word_.reserve(5 * words_.size());
        for (idx w = 0, wn = words_.size(); w < wn; ++w) {
            const auto& word = words_[w];
            const idx n = word.size();
            for (idx start = -1; start < n; ++start) {
                nodeid curr = 0;
                for (idx j = start; j >= 0; --j) {
                    const chr i = word[j];
                    add(curr, i);
                    curr = get(curr, i);
                }
                add(curr, rev_marker);
                curr = get(curr, rev_marker);
                for (idx j = start + 1; j < n; ++j) {
                    const chr i = word[j];
                    add(curr, i);
                    curr = get(curr, i);
                }
                while (curr >= idx(node_to_word_.size())) {
                    node_to_word_.push_back(invalid);
                }
                node_to_word_[curr] = w;
            }
        }
        const nodeid n_nodes = nodes_.size();
        next_sibling_.resize(n_nodes);
        first_child_.resize(n_nodes);
        val_.resize(n_nodes);
        for (nodeid node = 0; node < n_nodes; ++node) {
            for (chr child_chr = 0; child_chr < 32; ++child_chr) {
                nodeid child = get(node, child_chr);
                if (child != invalid) {
                    val_[child] = child_chr;
                }
            }
            for (chr child_chr = 0; child_chr < 32; ++child_chr) {
                nodeid child = get(node, child_chr);
                if (child != invalid) {
                    first_child_[node] = child;
                    break;
                }
            }
            nodeid last = invalid;
            for (chr child_chr = 0; child_chr < 32; ++child_chr) {
                nodeid child = get(node, child_chr);
                if (child != invalid) {
                    if (last != invalid) {
                        next_sibling_[last] = child;
                    }
                    last = child;
                }
            }
            if (last != invalid) {
                next_sibling_[last] = invalid;
            } else {
                first_child_[node] = invalid;
            }
        }
    }